

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodetxb.c
# Opt level: O1

void av1_get_nz_map_contexts_c
               (uint8_t *levels,int16_t *scan,uint16_t eob,TX_SIZE tx_size,TX_CLASS tx_class,
               int8_t *coeff_contexts)

{
  char cVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  byte *pbVar5;
  byte bVar6;
  int iVar7;
  undefined7 in_register_00000009;
  long lVar8;
  long lVar9;
  int col;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  ulong uVar16;
  
  uVar10 = (ulong)tx_size;
  iVar7 = (int)CONCAT71(in_register_00000009,tx_size);
  if (iVar7 < 0x11) {
    uVar16 = 3;
    if ((1 < iVar7 - 0xbU) && (iVar7 != 4)) {
LAB_001c3c34:
      uVar16 = uVar10;
    }
  }
  else if (iVar7 == 0x11) {
    uVar16 = 9;
  }
  else {
    if (iVar7 != 0x12) goto LAB_001c3c34;
    uVar16 = 10;
  }
  if (tx_size < 0x11) {
    uVar11 = 3;
    if ((tx_size - 0xb < 2) || (tx_size == '\x04')) goto LAB_001c3c6e;
  }
  else {
    if (tx_size == '\x11') {
      uVar11 = 9;
      goto LAB_001c3c6e;
    }
    if (tx_size == '\x12') {
      uVar11 = 10;
      goto LAB_001c3c6e;
    }
  }
  uVar11 = uVar10;
LAB_001c3c6e:
  if (eob != 0) {
    bVar6 = (byte)tx_size_high_log2[uVar16];
    lVar8 = (long)(1 << (bVar6 & 0x1f));
    lVar9 = (long)(2 << (bVar6 & 0x1f));
    iVar3 = tx_size_wide[uVar11] << (bVar6 & 0x1f);
    iVar13 = iVar3 + 3;
    iVar7 = iVar3 + 7;
    if (-1 < tx_size_wide[uVar11] << (bVar6 & 0x1f)) {
      iVar13 = iVar3;
      iVar7 = iVar3;
    }
    uVar16 = 0;
    do {
      uVar15 = (uint)scan[uVar16];
      if (eob - 1 == uVar16) {
        if (uVar16 == 0) {
          bVar2 = 0;
        }
        else {
          bVar2 = 1;
          if ((long)(iVar7 >> 3) < (long)uVar16) {
            bVar2 = (long)(iVar13 >> 2) < (long)uVar16 | 2;
          }
        }
      }
      else {
        iVar3 = (int)uVar15 >> (bVar6 & 0x1f);
        lVar12 = (long)(int)(uVar15 + iVar3 * 4);
        iVar14 = (uint)""[levels[lVar12 + 1]] + (uint)""[levels[lVar8 + 4 + lVar12]];
        if (tx_class == '\x02') {
          iVar14 = iVar14 + (uint)""[levels[lVar12 + 3]] + (uint)""[levels[lVar12 + 2]];
          pbVar5 = levels + lVar12 + 4;
        }
        else if (tx_class == '\0') {
          iVar14 = iVar14 + (uint)""[levels[lVar9 + lVar12 + 8]] +
                            (uint)""[levels[lVar8 + lVar12 + 5]];
          pbVar5 = levels + lVar12 + 2;
        }
        else {
          iVar14 = iVar14 + (uint)""[levels[(long)(3 << (bVar6 & 0x1f)) + lVar12 + 0xc]] +
                            (uint)""[levels[lVar9 + lVar12 + 8]];
          pbVar5 = levels + (4 << (bVar6 & 0x1f)) + lVar12 + 0x10;
        }
        bVar2 = 0;
        if (uVar15 != 0 || tx_class != '\0') {
          uVar4 = (uint)""[*pbVar5] + iVar14 + 1 >> 1;
          if (3 < uVar4) {
            uVar4 = 4;
          }
          cVar1 = (char)uVar4;
          if (tx_class == '\x02') {
            bVar2 = cVar1 + (char)nz_map_ctx_offset_1d[uVar15 & ~(-1 << (bVar6 & 0x1f))];
          }
          else if (tx_class == '\x01') {
            bVar2 = cVar1 + (char)nz_map_ctx_offset_1d[iVar3];
          }
          else if (tx_class == '\0') {
            bVar2 = cVar1 + av1_nz_map_ctx_offset[uVar10][(int)uVar15];
          }
        }
      }
      coeff_contexts[(int)uVar15] = bVar2;
      uVar16 = uVar16 + 1;
    } while (eob != uVar16);
  }
  return;
}

Assistant:

void av1_get_nz_map_contexts_c(const uint8_t *const levels,
                               const int16_t *const scan, const uint16_t eob,
                               const TX_SIZE tx_size, const TX_CLASS tx_class,
                               int8_t *const coeff_contexts) {
  const int bhl = get_txb_bhl(tx_size);
  const int width = get_txb_wide(tx_size);
  for (int i = 0; i < eob; ++i) {
    const int pos = scan[i];
    coeff_contexts[pos] = get_nz_map_ctx(levels, pos, bhl, width, i,
                                         i == eob - 1, tx_size, tx_class);
  }
}